

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

char cs222::getOpcode(string *op)

{
  bool bVar1;
  char cVar2;
  const_iterator cVar3;
  string local_50;
  string opp;
  
  std::__cxx11::string::string((string *)&opp,(string *)op);
  if (*opp._M_dataplus._M_p == '+') {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)op);
    std::__cxx11::string::operator=((string *)&opp,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar1 = isOperation(&opp);
  cVar2 = -1;
  if (bVar1) {
    toUpper(&local_50,&opp);
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)OpTable_abi_cxx11_,&local_50);
    cVar2 = Operation::getOpcode
                      ((Operation *)
                       ((long)cVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
                              ._M_cur + 0x28));
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&opp);
  return cVar2;
}

Assistant:

char getOpcode(const std::string& op)
    {
        std::string opp = op;
        if (opp[0] == '+')
        {
            opp = op.substr(1);
        }
        if (isOperation(opp))
        {
            return OpTable.find(toUpper(opp))->second.getOpcode();
        }

        return -1;
    }